

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void convolutional_decode_warmup(correct_convolutional *conv,uint sets,uint8_t *soft)

{
  distance_t *pdVar1;
  distance_t *pdVar2;
  size_t len;
  byte bVar3;
  distance_t dVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  size_t j;
  ulong uVar8;
  uint local_44;
  
  uVar5 = 0;
  while ((uVar5 < sets && (uVar7 = (ulong)uVar5, uVar7 < conv->order - 1))) {
    if (soft == (uint8_t *)0x0) {
      bVar3 = bit_reader_read(conv->bit_reader,(uint)conv->rate);
      local_44 = (uint)bVar3;
    }
    pdVar1 = conv->errors->read_errors;
    bVar3 = (byte)uVar5;
    pdVar2 = conv->errors->write_errors;
    uVar5 = uVar5 + 1;
    for (uVar8 = 0; uVar8 < (ulong)(long)(2 << (bVar3 & 0x1f)); uVar8 = uVar8 + 1) {
      if (soft == (uint8_t *)0x0) {
        uVar6 = conv->table[uVar8] ^ local_44;
        uVar6 = uVar6 - (uVar6 >> 1 & 0x55555555);
        uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
        dVar4 = (distance_t)(byte)(((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18);
      }
      else {
        len = conv->rate;
        if (conv->soft_measurement == CORRECT_SOFT_LINEAR) {
          dVar4 = metric_soft_distance_linear(conv->table[uVar8],soft + len * uVar7,len);
        }
        else {
          dVar4 = metric_soft_distance_quadratic(conv->table[uVar8],soft + len * uVar7,len);
        }
      }
      pdVar2[uVar8] = dVar4 + pdVar1[uVar8 >> 1 & 0xffffffff];
    }
    error_buffer_swap(conv->errors);
  }
  return;
}

Assistant:

void convolutional_decode_warmup(correct_convolutional *conv, unsigned int sets,
                                 const uint8_t *soft) {
    // first phase: load shiftregister up from 0 (order goes from 1 to conv->order)
    // we are building up error metrics for the first order bits
    for (unsigned int i = 0; i < conv->order - 1 && i < sets; i++) {
        // peel off rate bits from encoded to recover the same `out` as in the encoding process
        // the difference being that this `out` will have the channel noise/errors applied
        unsigned int out;
        if (!soft) {
            out = bit_reader_read(conv->bit_reader, conv->rate);
        }
        const distance_t *read_errors = conv->errors->read_errors;
        distance_t *write_errors = conv->errors->write_errors;
        // walk all of the state we have so far
        for (size_t j = 0; j < (1 << (i + 1)); j += 1) {
            unsigned int last = j >> 1;
            distance_t dist;
            if (soft) {
                if (conv->soft_measurement == CORRECT_SOFT_LINEAR) {
                    dist = metric_soft_distance_linear(conv->table[j], soft + i * conv->rate,
                                                       conv->rate);
                } else {
                    dist = metric_soft_distance_quadratic(conv->table[j], soft + i * conv->rate,
                                                          conv->rate);
                }
            } else {
                dist = metric_distance(conv->table[j], out);
            }
            write_errors[j] = dist + read_errors[last];
        }
        error_buffer_swap(conv->errors);
    }
}